

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QTreeWidgetItem_*>::clear(QList<QTreeWidgetItem_*> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QTreeWidgetItem_*> *this_00;
  __off_t __length;
  QArrayDataPointer<QTreeWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QTreeWidgetItem_*> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QTreeWidgetItem_*> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QTreeWidgetItem_*> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QTreeWidgetItem_*>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QTreeWidgetItem_*>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QTreeWidgetItem_*> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QTreeWidgetItem_*>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QTreeWidgetItem_*>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QTreeWidgetItem_*>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QTreeWidgetItem_*> *)
                QArrayDataPointer<QTreeWidgetItem_*>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QTreeWidgetItem_*>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }